

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_LR35902_LDI(void)

{
  bool bVar1;
  Z80Reg ZVar2;
  ulong uVar3;
  Z80Reg local_20;
  Z80Reg r2;
  int iStack_10;
  bool comma_ok;
  Z80Reg r1;
  int e [2];
  
  do {
    iStack_10 = -1;
    r1 = Z80_UNK;
    ZVar2 = GetRegister(&::lp);
    bVar1 = comma(&::lp);
    if (bVar1) {
      local_20 = GetRegister(&::lp);
    }
    else {
      local_20 = Z80_UNK;
    }
    if ((ZVar2 == Z80_MEM_HL) && (local_20 == Z80_A)) {
      iStack_10 = 0x22;
    }
    if ((ZVar2 == Z80_A) && (local_20 == Z80_MEM_HL)) {
      iStack_10 = 0x2a;
    }
    EmitBytes(&stack0xfffffffffffffff0,true);
    uVar3 = (*DAT_001e16b0)(&::lp);
  } while ((uVar3 & 1) != 0);
  return;
}

Assistant:

static void OpCode_LR35902_LDI() {
		// ldi (hl),a = ld (hl+),a = 0x22
		// ldi a,(hl) = ld a,(hl+) = 0x2A
		do {
			int e[] { -1, -1 };
			const Z80Reg r1 = GetRegister(lp);
			const bool comma_ok = comma(lp);
			const Z80Reg r2 = comma_ok ? GetRegister(lp) : Z80_UNK;
			if (Z80_MEM_HL == r1 && Z80_A == r2) e[0] = 0x22;
			if (Z80_A == r1 && Z80_MEM_HL == r2) e[0] = 0x2A;
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}